

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arena_i_dss_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                   size_t newlen)

{
  char *__s2;
  arena_t *arena;
  _Bool _Var1;
  int iVar2;
  dss_prec_t dVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  size_t __n;
  char *dss;
  undefined8 *local_38;
  
  dss = (char *)0x0;
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  iVar4 = 0xe;
  if (newp == (void *)0x0) {
    uVar5 = mib[1];
    if (uVar5 >> 0x20 != 0) goto LAB_01f8a15b;
  }
  else {
    if (newlen != 8) {
      iVar4 = 0x16;
      goto LAB_01f8a15b;
    }
    __s2 = *newp;
    uVar5 = mib[1];
    dss = __s2;
    if (uVar5 >> 0x20 != 0) goto LAB_01f8a15b;
    if (__s2 != (char *)0x0) {
      local_38 = (undefined8 *)oldp;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        iVar2 = strcmp(duckdb_je_dss_prec_names[lVar6],__s2);
        oldp = local_38;
        if (iVar2 == 0) goto LAB_01f8a0f6;
      }
      iVar4 = 0x16;
      goto LAB_01f8a15b;
    }
  }
  lVar6 = 3;
LAB_01f8a0f6:
  dVar3 = (dss_prec_t)lVar6;
  if ((uVar5 == 0x1000) || (ctl_arenas->narenas == (uint)uVar5)) {
    if ((dVar3 != dss_prec_limit) && (_Var1 = duckdb_je_extent_dss_prec_set(dVar3), _Var1))
    goto LAB_01f8a15b;
    dVar3 = duckdb_je_extent_dss_prec_get();
  }
  else {
    arena = (arena_t *)duckdb_je_arenas[uVar5].repr;
    if ((arena == (arena_t *)0x0) ||
       ((dVar3 != dss_prec_limit && (_Var1 = duckdb_je_arena_dss_prec_set(arena,dVar3), _Var1))))
    goto LAB_01f8a15b;
    dVar3 = duckdb_je_arena_dss_prec_get(arena);
  }
  dss = duckdb_je_dss_prec_names[dVar3];
  iVar4 = 0;
  if (oldlenp != (size_t *)0x0 && (undefined8 *)oldp != (undefined8 *)0x0) {
    uVar5 = *oldlenp;
    if (uVar5 == 8) {
      *(char **)oldp = dss;
    }
    else {
      __n = 8;
      if (uVar5 < 8) {
        __n = uVar5;
      }
      switchD_016b0717::default(oldp,&dss,__n);
      *oldlenp = __n;
      iVar4 = 0x16;
    }
  }
LAB_01f8a15b:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar4;
}

Assistant:

static int
arena_i_dss_ctl(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	const char *dss = NULL;
	unsigned arena_ind;
	dss_prec_t dss_prec = dss_prec_limit;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	WRITE(dss, const char *);
	MIB_UNSIGNED(arena_ind, 1);
	if (dss != NULL) {
		int i;
		bool match = false;

		for (i = 0; i < dss_prec_limit; i++) {
			if (strcmp(dss_prec_names[i], dss) == 0) {
				dss_prec = i;
				match = true;
				break;
			}
		}

		if (!match) {
			ret = EINVAL;
			goto label_return;
		}
	}

	/*
	 * Access via index narenas is deprecated, and scheduled for removal in
	 * 6.0.0.
	 */
	dss_prec_t dss_prec_old;
	if (arena_ind == MALLCTL_ARENAS_ALL || arena_ind ==
	    ctl_arenas->narenas) {
		if (dss_prec != dss_prec_limit &&
		    extent_dss_prec_set(dss_prec)) {
			ret = EFAULT;
			goto label_return;
		}
		dss_prec_old = extent_dss_prec_get();
	} else {
		arena_t *arena = arena_get(tsd_tsdn(tsd), arena_ind, false);
		if (arena == NULL || (dss_prec != dss_prec_limit &&
		    arena_dss_prec_set(arena, dss_prec))) {
			ret = EFAULT;
			goto label_return;
		}
		dss_prec_old = arena_dss_prec_get(arena);
	}

	dss = dss_prec_names[dss_prec_old];
	READ(dss, const char *);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}